

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O1

void makect(int nc,int *ip,float *c)

{
  ulong uVar1;
  uint uVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  
  ip[1] = nc;
  if (1 < nc) {
    uVar2 = (uint)nc >> 1;
    fVar4 = cosf((float)uVar2 * (0.7853982 / (float)uVar2));
    *c = fVar4;
    c[uVar2] = fVar4 * 0.5;
    if (3 < (uint)nc) {
      pfVar3 = c + (uint)nc;
      uVar1 = 1;
      do {
        pfVar3 = pfVar3 + -1;
        fVar4 = (float)(int)uVar1 * (0.7853982 / (float)uVar2);
        fVar5 = cosf(fVar4);
        c[uVar1] = fVar5 * 0.5;
        fVar4 = sinf(fVar4);
        *pfVar3 = fVar4 * 0.5;
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
  }
  return;
}

Assistant:

void makect(int nc, int *ip, float *c)
{
    int j, nch;
    float delta;

    ip[1] = nc;
    if (nc > 1) {
        nch = nc >> 1;
        delta = atan(1.0) / nch;
        c[0] = cos(delta * nch);
        c[nch] = 0.5 * c[0];
        for (j = 1; j < nch; j++) {
            c[j] = 0.5 * cos(delta * j);
            c[nc - j] = 0.5 * sin(delta * j);
        }
    }
}